

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_band.c
# Opt level: O0

SUNErrCode SUNMatCopy_Band(SUNMatrix A,SUNMatrix B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  SUNMatrix in_RSI;
  long *in_RDI;
  sunrealtype *B_colj;
  sunrealtype *A_colj;
  sunindextype smu;
  sunindextype mu;
  sunindextype ml;
  sunindextype colSize;
  sunindextype j;
  sunindextype i;
  SUNContext_conflict sunctx_local_scope_;
  long local_70;
  undefined8 local_68;
  long local_60;
  long local_28;
  long local_20;
  
  if ((*(long *)((long)in_RSI->content + 0x18) < *(long *)(*in_RDI + 0x18)) ||
     (*(long *)((long)in_RSI->content + 0x20) < *(long *)(*in_RDI + 0x20))) {
    if (*(long *)(*in_RDI + 0x20) < *(long *)((long)in_RSI->content + 0x20)) {
      local_60 = *(long *)((long)in_RSI->content + 0x20);
    }
    else {
      local_60 = *(long *)(*in_RDI + 0x20);
    }
    if (*(long *)(*in_RDI + 0x18) < *(long *)((long)in_RSI->content + 0x18)) {
      local_68 = *(undefined8 *)((long)in_RSI->content + 0x18);
    }
    else {
      local_68 = *(undefined8 *)(*in_RDI + 0x18);
    }
    if (*(long *)(*in_RDI + 0x28) < *(long *)((long)in_RSI->content + 0x28)) {
      local_70 = *(long *)((long)in_RSI->content + 0x28);
    }
    else {
      local_70 = *(long *)(*in_RDI + 0x28);
    }
    lVar4 = local_70 + local_60 + 1;
    *(undefined8 *)((long)in_RSI->content + 0x18) = local_68;
    *(long *)((long)in_RSI->content + 0x20) = local_60;
    *(long *)((long)in_RSI->content + 0x28) = local_70;
    *(long *)((long)in_RSI->content + 0x10) = lVar4;
    *(long *)((long)in_RSI->content + 0x38) = *(long *)((long)in_RSI->content + 8) * lVar4;
    pvVar5 = realloc(*(void **)((long)in_RSI->content + 0x30),
                     *(long *)((long)in_RSI->content + 8) * lVar4 * 8);
    *(void **)((long)in_RSI->content + 0x30) = pvVar5;
    for (local_28 = 0; local_28 < *(long *)((long)in_RSI->content + 8); local_28 = local_28 + 1) {
      *(long *)(*(long *)((long)in_RSI->content + 0x40) + local_28 * 8) =
           *(long *)((long)in_RSI->content + 0x30) + local_28 * lVar4 * 8;
    }
  }
  SUNMatZero_Band(in_RSI);
  for (local_28 = 0; local_28 < *(long *)((long)in_RSI->content + 8); local_28 = local_28 + 1) {
    lVar4 = *(long *)(*(long *)((long)in_RSI->content + 0x40) + local_28 * 8);
    lVar1 = *(long *)((long)in_RSI->content + 0x28);
    lVar2 = *(long *)(*(long *)(*in_RDI + 0x40) + local_28 * 8);
    lVar3 = *(long *)(*in_RDI + 0x28);
    for (local_20 = -*(long *)(*in_RDI + 0x18); local_20 <= *(long *)(*in_RDI + 0x20);
        local_20 = local_20 + 1) {
      *(undefined8 *)(lVar4 + lVar1 * 8 + local_20 * 8) =
           *(undefined8 *)(lVar2 + lVar3 * 8 + local_20 * 8);
    }
  }
  return 0;
}

Assistant:

SUNErrCode SUNMatCopy_Band(SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);
  sunindextype i, j, colSize, ml, mu, smu;
  sunrealtype *A_colj, *B_colj;

  SUNAssert(SUNMatGetID(A) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(SUNMatGetID(B) == SUNMATRIX_BAND, SUN_ERR_ARG_WRONGTYPE);
  SUNCheck(compatibleMatrices(A, B), SUN_ERR_ARG_DIMSMISMATCH);

  /* Grow B if A's bandwidth is larger */
  if ((SM_UBAND_B(A) > SM_UBAND_B(B)) || (SM_LBAND_B(A) > SM_LBAND_B(B)))
  {
    ml                     = SUNMAX(SM_LBAND_B(B), SM_LBAND_B(A));
    mu                     = SUNMAX(SM_UBAND_B(B), SM_UBAND_B(A));
    smu                    = SUNMAX(SM_SUBAND_B(B), SM_SUBAND_B(A));
    colSize                = smu + ml + 1;
    SM_CONTENT_B(B)->mu    = mu;
    SM_CONTENT_B(B)->ml    = ml;
    SM_CONTENT_B(B)->s_mu  = smu;
    SM_CONTENT_B(B)->ldim  = colSize;
    SM_CONTENT_B(B)->ldata = SM_COLUMNS_B(B) * colSize;
    SM_CONTENT_B(B)->data =
      (sunrealtype*)realloc(SM_CONTENT_B(B)->data,
                            SM_COLUMNS_B(B) * colSize * sizeof(sunrealtype));
    for (j = 0; j < SM_COLUMNS_B(B); j++)
    {
      SM_CONTENT_B(B)->cols[j] = SM_CONTENT_B(B)->data + j * colSize;
    }
  }

  /* Perform operation */
  SUNCheckCall(SUNMatZero_Band(B));
  for (j = 0; j < SM_COLUMNS_B(B); j++)
  {
    B_colj = SM_COLUMN_B(B, j);
    A_colj = SM_COLUMN_B(A, j);
    for (i = -SM_UBAND_B(A); i <= SM_LBAND_B(A); i++) { B_colj[i] = A_colj[i]; }
  }
  return SUN_SUCCESS;
}